

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

int run_ifr_test(igsc_device_handle *handle,uint8_t test_type,uint8_t tiles_mask)

{
  uint uVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  uint local_34;
  uint retries;
  int ret;
  uint8_t tiles_mask_local;
  uint8_t test_type_local;
  igsc_device_handle *handle_local;
  uint local_18;
  uint8_t result;
  uint32_t error_code;
  uint8_t run_status;
  
  _error_code = *(long *)(in_FS_OFFSET + 0x28);
  result = '\0';
  local_18 = 0;
  handle_local._7_1_ = 0;
  local_34 = 0;
  pcVar2 = "scan";
  if (test_type == '\x01') {
    pcVar2 = "array";
  }
  printf("requesting to run test %u (%s) for tiles: (%u,%u)\n",(ulong)test_type,pcVar2,
         (ulong)((tiles_mask & 1) != 0),(ulong)((tiles_mask & 2) != 0));
  do {
    uVar1 = igsc_ifr_run_test(handle,test_type,tiles_mask,(long)&handle_local + 7,&result,&local_18)
    ;
    if (uVar1 != 0xd) break;
    gsc_msleep(2000);
    local_34 = local_34 + 1;
  } while (local_34 < 3);
  if ((uVar1 == 0) && (handle_local._7_1_ == 0)) {
    print_run_test_status(result);
    printf("error_code is %u\n",(ulong)local_18);
    handle_local._0_4_ = 0;
  }
  else {
    if ((quiet & 1U) == 0) {
      fprintf(_stderr,"Error: Failed to run test, library return code %d Heci result %u\n",
              (ulong)uVar1,(ulong)handle_local._7_1_);
    }
    print_device_fw_status(handle);
    handle_local._0_4_ = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != _error_code) {
    __stack_chk_fail();
  }
  return (int)handle_local;
}

Assistant:

mockable_static
int run_ifr_test(struct igsc_device_handle *handle, uint8_t test_type, uint8_t tiles_mask)
{
    int ret;
    uint8_t run_status = 0;
    uint32_t error_code = 0;
    uint8_t result = 0;
    unsigned int retries = 0;

    printf("requesting to run test %u (%s) for tiles: (%u,%u)\n",
           test_type,
           (test_type == 1) ? "array" : "scan",
           !!(tiles_mask & IGSC_IFR_TILE_0),
           !!(tiles_mask & IGSC_IFR_TILE_1));

    /* call the igsc library routine to run the ifr test */
    while ((ret = igsc_ifr_run_test(handle, test_type, tiles_mask, &result, &run_status, &error_code)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret || result)
    {
        fwupd_error("Failed to run test, library return code %d Heci result %u\n",
                    ret, result);
        print_device_fw_status(handle);
        return EXIT_FAILURE;
    }

    print_run_test_status(run_status);
    printf("error_code is %u\n", error_code);
    return ret;
}